

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paf_score_graph.cpp
# Opt level: O2

void trt_pose::parse::paf_score_graph_out_khw
               (float *score_graph,int *topology,float *paf,int *counts,float *peaks,int K,int C,
               int H,int W,int M,int num_integral_samples)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)K;
  if (K < 1) {
    uVar3 = uVar4;
  }
  for (lVar5 = 0; uVar3 << 4 != lVar5; lVar5 = lVar5 + 0x10) {
    iVar1 = *(int *)((long)topology + lVar5 + 8);
    iVar2 = *(int *)((long)topology + lVar5 + 0xc);
    paf_score_graph_out_hw
              (score_graph + (int)uVar4,paf + *(int *)((long)topology + lVar5) * W * H,
               paf + *(int *)((long)topology + lVar5 + 4) * W * H,counts[iVar1],counts[iVar2],
               peaks + M * 2 * iVar1,peaks + iVar2 * M * 2,H,W,M,num_integral_samples);
    uVar4 = (ulong)(uint)((int)uVar4 + M * M);
  }
  return;
}

Assistant:

void paf_score_graph_out_khw(float *score_graph,  // KxMxM
                             const int *topology, // Kx4
                             const float *paf,    // 2KxHxW
                             const int *counts,   // C
                             const float *peaks,  // CxMx2
                             const int K, const int C, const int H, const int W,
                             const int M, const int num_integral_samples) {
  for (int k = 0; k < K; k++) {
    float *score_graph_k = &score_graph[k * M * M];
    const int *tk = &topology[k * 4];
    const int paf_i_idx = tk[0];
    const int paf_j_idx = tk[1];
    const int cmap_a_idx = tk[2];
    const int cmap_b_idx = tk[3];
    const float *paf_i = &paf[paf_i_idx * H * W];
    const float *paf_j = &paf[paf_j_idx * H * W];

    const int counts_a = counts[cmap_a_idx];
    const int counts_b = counts[cmap_b_idx];
    const float *peaks_a = &peaks[cmap_a_idx * M * 2];
    const float *peaks_b = &peaks[cmap_b_idx * M * 2];

    paf_score_graph_out_hw(score_graph_k, paf_i, paf_j, counts_a, counts_b,
                           peaks_a, peaks_b, H, W, M, num_integral_samples);
  }
}